

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<unsigned_char,signed_char,5>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (uchar *lhs,char *rhs,uchar *result)

{
  byte bVar1;
  int iVar2;
  undefined1 *in_RDX;
  char *in_RSI;
  byte *in_RDI;
  int32_t tmp;
  
  iVar2 = (uint)*in_RDI + (int)*in_RSI;
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if (iVar2 <= (int)(uint)bVar1) {
    bVar1 = std::numeric_limits<unsigned_char>::min();
    if ((int)(uint)bVar1 <= iVar2) {
      *in_RDX = (char)iVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // 16-bit or less - one or both are signed
        std::int32_t tmp = lhs + rhs;

        if( tmp <= (std::int32_t)std::numeric_limits<T>::max() && tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }